

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BottomLevelASVkImpl.cpp
# Opt level: O2

void __thiscall
Diligent::BottomLevelASVkImpl::BottomLevelASVkImpl
          (BottomLevelASVkImpl *this,IReferenceCounters *pRefCounters,
          RenderDeviceVkImpl *pRenderDeviceVk,BottomLevelASDesc *Desc)

{
  BottomLevelASDesc *Args_1;
  AccelStructWrapper *this_00;
  BufferWrapper *this_01;
  VulkanPhysicalDevice *this_02;
  VulkanLogicalDevice *this_03;
  BLASTriangleDesc *pBVar1;
  BLASBoundingBoxDesc *pBVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  BottomLevelASVkImpl *pBVar7;
  pointer pVVar8;
  VkFormat VVar9;
  Uint32 UVar10;
  VkIndexType VVar11;
  uint uVar12;
  VkBuildAccelerationStructureFlagsKHR VVar13;
  uint32_t MemoryTypeIndex;
  VkResult errorCode;
  Uint32 *pUVar14;
  VkDeviceSize memoryOffset;
  char *pcVar15;
  VkDeviceAddress VVar16;
  void **ppvVar17;
  ulong uVar18;
  Uint64 UVar19;
  ScratchBufferSizes SVar20;
  VkMemoryRequirements MemReqs;
  uint local_148;
  Uint32 MaxPrimitiveCount;
  BottomLevelASVkImpl *local_140;
  vector<VkAccelerationStructureGeometryKHR,_std::allocator<VkAccelerationStructureGeometryKHR>_>
  vkGeometries;
  vector<unsigned_int,_std::allocator<unsigned_int>_> MaxPrimitiveCounts;
  VkAccelerationStructureBuildGeometryInfoKHR vkBuildInfo;
  string msg_1;
  Char *local_70;
  VkAccelerationStructureBuildSizesInfoKHR vkSizeInfo;
  
  BottomLevelASBase<Diligent::EngineVkImplTraits>::BottomLevelASBase
            (&this->super_BottomLevelASBase<Diligent::EngineVkImplTraits>,pRefCounters,
             pRenderDeviceVk,Desc,false);
  (this->super_BottomLevelASBase<Diligent::EngineVkImplTraits>).
  super_DeviceObjectBase<Diligent::IBottomLevelASVk,_Diligent::RenderDeviceVkImpl,_Diligent::BottomLevelASDesc>
  .super_ObjectBase<Diligent::IBottomLevelASVk>.super_RefCountedObject<Diligent::IBottomLevelASVk>.
  super_IBottomLevelASVk.super_IBottomLevelAS.super_IDeviceObject =
       (IDeviceObject)&PTR_QueryInterface_00891c28;
  this_00 = &this->m_VulkanBLAS;
  this_01 = &this->m_VulkanBuffer;
  this->m_DeviceAddress = 0;
  (this->m_VulkanBLAS).m_pLogicalDevice.
  super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  *(undefined1 (*) [16])
   &(this->m_VulkanBLAS).m_pLogicalDevice.
    super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount = (undefined1  [16])0x0;
  (this->m_VulkanBuffer).m_pLogicalDevice.
  super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2> =
       (__shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>)0x0;
  *(undefined1 (*) [16])&(this->m_VulkanBuffer).m_VkObject = (undefined1  [16])0x0;
  (this->m_MemoryAllocation).UnalignedOffset = 0;
  (this->m_MemoryAllocation).Size = 0;
  this->m_MemoryAlignedOffset = 0;
  this_02 = (pRenderDeviceVk->m_PhysicalDevice)._M_t.
            super___uniq_ptr_impl<VulkanUtilities::VulkanPhysicalDevice,_std::default_delete<VulkanUtilities::VulkanPhysicalDevice>_>
            ._M_t.
            super__Tuple_impl<0UL,_VulkanUtilities::VulkanPhysicalDevice_*,_std::default_delete<VulkanUtilities::VulkanPhysicalDevice>_>
            .super__Head_base<0UL,_VulkanUtilities::VulkanPhysicalDevice_*,_false>._M_head_impl;
  this_03 = (pRenderDeviceVk->m_LogicalVkDevice).
            super___shared_ptr<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr;
  UVar19 = (this->super_BottomLevelASBase<Diligent::EngineVkImplTraits>).
           super_DeviceObjectBase<Diligent::IBottomLevelASVk,_Diligent::RenderDeviceVkImpl,_Diligent::BottomLevelASDesc>
           .m_Desc.CompactedSize;
  local_140 = this;
  if (UVar19 != 0) goto LAB_001acc1a;
  vkBuildInfo.ppGeometries = (VkAccelerationStructureGeometryKHR **)0x0;
  vkBuildInfo.scratchData = (VkDeviceOrHostAddressKHR)0x0;
  vkBuildInfo.geometryCount = 0;
  vkBuildInfo._52_4_ = 0;
  vkBuildInfo.pGeometries = (VkAccelerationStructureGeometryKHR *)0x0;
  vkBuildInfo.srcAccelerationStructure = (VkAccelerationStructureKHR)0x0;
  vkBuildInfo.dstAccelerationStructure = (VkAccelerationStructureKHR)0x0;
  vkBuildInfo.type = VK_ACCELERATION_STRUCTURE_TYPE_TOP_LEVEL_KHR;
  vkBuildInfo.flags = 0;
  vkBuildInfo.mode = VK_BUILD_ACCELERATION_STRUCTURE_MODE_BUILD_KHR;
  vkBuildInfo._28_4_ = 0;
  vkBuildInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  vkBuildInfo._4_4_ = 0;
  vkBuildInfo.pNext = (void *)0x0;
  vkGeometries.
  super__Vector_base<VkAccelerationStructureGeometryKHR,_std::allocator<VkAccelerationStructureGeometryKHR>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vkGeometries.
  super__Vector_base<VkAccelerationStructureGeometryKHR,_std::allocator<VkAccelerationStructureGeometryKHR>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vkGeometries.
  super__Vector_base<VkAccelerationStructureGeometryKHR,_std::allocator<VkAccelerationStructureGeometryKHR>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  MaxPrimitiveCounts.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  MaxPrimitiveCounts.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  MaxPrimitiveCounts.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  vkSizeInfo.accelerationStructureSize = 0;
  vkSizeInfo.updateScratchSize = 0;
  vkSizeInfo.buildScratchSize._0_4_ = 0;
  vkSizeInfo.buildScratchSize._4_4_ = 0;
  vkSizeInfo._4_12_ = SUB1612((undefined1  [16])0x0,4);
  vkSizeInfo.sType = VK_STRUCTURE_TYPE_ACCELERATION_STRUCTURE_BUILD_SIZES_INFO_KHR;
  std::
  vector<VkAccelerationStructureGeometryKHR,_std::allocator<VkAccelerationStructureGeometryKHR>_>::
  resize(&vkGeometries,(ulong)Desc->BoxCount + (ulong)Desc->TriangleCount);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (&MaxPrimitiveCounts,
             ((long)vkGeometries.
                    super__Vector_base<VkAccelerationStructureGeometryKHR,_std::allocator<VkAccelerationStructureGeometryKHR>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)vkGeometries.
                   super__Vector_base<VkAccelerationStructureGeometryKHR,_std::allocator<VkAccelerationStructureGeometryKHR>_>
                   ._M_impl.super__Vector_impl_data._M_start) / 0x60);
  if ((this->super_BottomLevelASBase<Diligent::EngineVkImplTraits>).
      super_DeviceObjectBase<Diligent::IBottomLevelASVk,_Diligent::RenderDeviceVkImpl,_Diligent::BottomLevelASDesc>
      .m_Desc.pTriangles == (BLASTriangleDesc *)0x0) {
    pBVar2 = (this->super_BottomLevelASBase<Diligent::EngineVkImplTraits>).
             super_DeviceObjectBase<Diligent::IBottomLevelASVk,_Diligent::RenderDeviceVkImpl,_Diligent::BottomLevelASDesc>
             .m_Desc.pBoxes;
    if (pBVar2 == (BLASBoundingBoxDesc *)0x0) {
      FormatString<char[45]>
                ((string *)&MemReqs,(char (*) [45])"Either pTriangles or pBoxes must not be null");
      DebugAssertionFailed
                ((Char *)MemReqs.size,"BottomLevelASVkImpl",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/BottomLevelASVkImpl.cpp"
                 ,0x81);
    }
    else {
      msg_1._M_dataplus._M_p._0_4_ = 0;
      pUVar14 = &pBVar2->MaxBoxCount;
      ppvVar17 = &((vkGeometries.
                    super__Vector_base<VkAccelerationStructureGeometryKHR,_std::allocator<VkAccelerationStructureGeometryKHR>_>
                    ._M_impl.super__Vector_impl_data._M_start)->geometry).triangles.pNext;
      for (uVar18 = 0;
          uVar18 < (this->super_BottomLevelASBase<Diligent::EngineVkImplTraits>).
                   super_DeviceObjectBase<Diligent::IBottomLevelASVk,_Diligent::RenderDeviceVkImpl,_Diligent::BottomLevelASDesc>
                   .m_Desc.BoxCount; uVar18 = uVar18 + 1) {
        *(undefined4 *)(ppvVar17 + -4) = 0x3b9d13f6;
        ppvVar17[-3] = (void *)0x0;
        *(undefined4 *)(ppvVar17 + -2) = 1;
        ((VkAccelerationStructureGeometryTrianglesDataKHR *)(ppvVar17 + -1))->sType =
             VK_STRUCTURE_TYPE_ACCELERATION_STRUCTURE_GEOMETRY_AABBS_DATA_KHR;
        *ppvVar17 = (void *)0x0;
        UVar10 = *pUVar14;
        MaxPrimitiveCounts.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start[uVar18] = UVar10;
        msg_1._M_dataplus._M_p._0_4_ = UVar10 + (uint)msg_1._M_dataplus._M_p;
        pUVar14 = pUVar14 + 4;
        ppvVar17 = ppvVar17 + 0xc;
      }
      if ((uint)msg_1._M_dataplus._M_p <=
          (pRenderDeviceVk->
          super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
          ).super_RenderDeviceBase<Diligent::EngineVkImplTraits>.m_AdapterInfo.RayTracing.
          MaxPrimitivesPerBLAS) goto LAB_001acb1b;
      FormatString<char[16],unsigned_int,char[25],unsigned_int,char[2]>
                ((string *)&MemReqs,(Diligent *)"Max box count (",(char (*) [16])&msg_1,
                 (uint *)") exceeds device limit (",
                 (char (*) [25])
                 &(pRenderDeviceVk->
                  super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
                  ).super_RenderDeviceBase<Diligent::EngineVkImplTraits>.m_AdapterInfo.RayTracing.
                  MaxPrimitivesPerBLAS,(uint *)0x647201,(char (*) [2])MemReqs.size);
      DebugAssertionFailed
                ((Char *)MemReqs.size,"BottomLevelASVkImpl",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/BottomLevelASVkImpl.cpp"
                 ,0x7c);
    }
LAB_001acb13:
    std::__cxx11::string::~string((string *)&MemReqs);
  }
  else {
    MaxPrimitiveCount = 0;
    uVar12 = 0;
    while (local_148 = uVar12,
          uVar12 < (this->super_BottomLevelASBase<Diligent::EngineVkImplTraits>).
                   super_DeviceObjectBase<Diligent::IBottomLevelASVk,_Diligent::RenderDeviceVkImpl,_Diligent::BottomLevelASDesc>
                   .m_Desc.TriangleCount) {
      pBVar1 = (this->super_BottomLevelASBase<Diligent::EngineVkImplTraits>).
               super_DeviceObjectBase<Diligent::IBottomLevelASVk,_Diligent::RenderDeviceVkImpl,_Diligent::BottomLevelASDesc>
               .m_Desc.pTriangles;
      pVVar8 = vkGeometries.
               super__Vector_base<VkAccelerationStructureGeometryKHR,_std::allocator<VkAccelerationStructureGeometryKHR>_>
               ._M_impl.super__Vector_impl_data._M_start;
      vkGeometries.
      super__Vector_base<VkAccelerationStructureGeometryKHR,_std::allocator<VkAccelerationStructureGeometryKHR>_>
      ._M_impl.super__Vector_impl_data._M_start[uVar12].sType =
           VK_STRUCTURE_TYPE_ACCELERATION_STRUCTURE_GEOMETRY_KHR;
      vkGeometries.
      super__Vector_base<VkAccelerationStructureGeometryKHR,_std::allocator<VkAccelerationStructureGeometryKHR>_>
      ._M_impl.super__Vector_impl_data._M_start[uVar12].pNext = (void *)0x0;
      vkGeometries.
      super__Vector_base<VkAccelerationStructureGeometryKHR,_std::allocator<VkAccelerationStructureGeometryKHR>_>
      ._M_impl.super__Vector_impl_data._M_start[uVar12].geometryType =
           VK_GEOMETRY_TYPE_TRIANGLES_KHR;
      vkGeometries.
      super__Vector_base<VkAccelerationStructureGeometryKHR,_std::allocator<VkAccelerationStructureGeometryKHR>_>
      ._M_impl.super__Vector_impl_data._M_start[uVar12].flags = 0;
      vkGeometries.
      super__Vector_base<VkAccelerationStructureGeometryKHR,_std::allocator<VkAccelerationStructureGeometryKHR>_>
      ._M_impl.super__Vector_impl_data._M_start[uVar12].geometry.triangles.sType =
           VK_STRUCTURE_TYPE_ACCELERATION_STRUCTURE_GEOMETRY_TRIANGLES_DATA_KHR;
      vkGeometries.
      super__Vector_base<VkAccelerationStructureGeometryKHR,_std::allocator<VkAccelerationStructureGeometryKHR>_>
      ._M_impl.super__Vector_impl_data._M_start[uVar12].geometry.triangles.pNext = (void *)0x0;
      VVar9 = TypeToVkFormat(pBVar1[uVar12].VertexValueType,
                             (uint)pBVar1[uVar12].VertexComponentCount,
                             pBVar1[uVar12].VertexValueType < VT_FLOAT16);
      pVVar8[uVar12].geometry.triangles.vertexFormat = VVar9;
      UVar10 = pBVar1[uVar12].MaxVertexCount;
      if (UVar10 == 0) {
        FormatString<char[38]>
                  ((string *)&MemReqs,(char (*) [38])"MaxVertexCount must be greater than 0");
        DebugAssertionFailed
                  ((Char *)MemReqs.size,"BottomLevelASVkImpl",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/BottomLevelASVkImpl.cpp"
                   ,0x4b);
        std::__cxx11::string::~string((string *)&MemReqs);
        UVar10 = pBVar1[uVar12].MaxVertexCount;
      }
      pVVar8[uVar12].geometry.triangles.maxVertex = UVar10 - 1;
      VVar11 = TypeToVkIndexType(pBVar1[uVar12].IndexType);
      pVVar8[uVar12].geometry.triangles.indexType = VVar11;
      *(ulong *)((long)&pVVar8[uVar12].geometry + 0x38) = (ulong)pBVar1[uVar12].AllowsTransforms;
      UVar10 = pBVar1[uVar12].MaxPrimitiveCount;
      MaxPrimitiveCounts.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start[local_148] = UVar10;
      MaxPrimitiveCount = MaxPrimitiveCount + UVar10;
      stack0xfffffffffffffe98 =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            )0x0;
      MemReqs._4_12_ = SUB1612((undefined1  [16])0x0,4);
      MemReqs.size._0_4_ = 0x3b9bb07a;
      (*vkGetPhysicalDeviceFormatProperties2KHR)
                (this_02->m_VkDevice,pVVar8[uVar12].geometry.triangles.vertexFormat,
                 (VkFormatProperties2 *)&MemReqs);
      if (((undefined1  [16])stack0xfffffffffffffe98 & (undefined1  [16])0x20000000) ==
          (undefined1  [16])0x0) {
        local_70 = GetValueTypeString(pBVar1[uVar12].VertexValueType);
        FormatString<char[27],unsigned_int,char[20],char_const*,char[18],unsigned_int,char[25],unsigned_char,char[35]>
                  (&msg_1,(Diligent *)"combination of pTriangles[",(char (*) [27])&local_148,
                   (uint *)"].VertexValueType (",(char (*) [20])&local_70,
                   (char **)") and pTriangles[",(char (*) [18])&local_148,
                   (uint *)"].VertexComponentCount (",
                   (char (*) [25])&pBVar1[uVar12].VertexComponentCount,
                   (uchar *)") is not supported by this device.",(char (*) [35])MemReqs.size);
        DebugAssertionFailed
                  ((Char *)CONCAT44(msg_1._M_dataplus._M_p._4_4_,(uint)msg_1._M_dataplus._M_p),
                   "BottomLevelASVkImpl",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/BottomLevelASVkImpl.cpp"
                   ,0x5d);
        std::__cxx11::string::~string((string *)&msg_1);
      }
      this = local_140;
      uVar12 = local_148 + 1;
    }
    if ((pRenderDeviceVk->
        super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
        ).super_RenderDeviceBase<Diligent::EngineVkImplTraits>.m_AdapterInfo.RayTracing.
        MaxPrimitivesPerBLAS < MaxPrimitiveCount) {
      FormatString<char[23],unsigned_int,char[25],unsigned_int,char[2]>
                ((string *)&MemReqs,(Diligent *)"Max primitives count (",
                 (char (*) [23])&MaxPrimitiveCount,(uint *)") exceeds device limit (",
                 (char (*) [25])
                 &(pRenderDeviceVk->
                  super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
                  ).super_RenderDeviceBase<Diligent::EngineVkImplTraits>.m_AdapterInfo.RayTracing.
                  MaxPrimitivesPerBLAS,(uint *)0x647201,(char (*) [2])MemReqs.size);
      DebugAssertionFailed
                ((Char *)MemReqs.size,"BottomLevelASVkImpl",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/BottomLevelASVkImpl.cpp"
                 ,0x65);
      goto LAB_001acb13;
    }
  }
LAB_001acb1b:
  vkBuildInfo.sType = VK_STRUCTURE_TYPE_ACCELERATION_STRUCTURE_BUILD_GEOMETRY_INFO_KHR;
  VVar13 = BuildASFlagsToVkBuildAccelerationStructureFlags
                     ((this->super_BottomLevelASBase<Diligent::EngineVkImplTraits>).
                      super_DeviceObjectBase<Diligent::IBottomLevelASVk,_Diligent::RenderDeviceVkImpl,_Diligent::BottomLevelASDesc>
                      .m_Desc.Flags);
  vkBuildInfo.flags = VVar13;
  vkBuildInfo.type = VK_ACCELERATION_STRUCTURE_TYPE_BOTTOM_LEVEL_KHR;
  vkBuildInfo.pGeometries =
       vkGeometries.
       super__Vector_base<VkAccelerationStructureGeometryKHR,_std::allocator<VkAccelerationStructureGeometryKHR>_>
       ._M_impl.super__Vector_impl_data._M_start;
  uVar12 = (uint)(((long)vkGeometries.
                         super__Vector_base<VkAccelerationStructureGeometryKHR,_std::allocator<VkAccelerationStructureGeometryKHR>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)vkGeometries.
                        super__Vector_base<VkAccelerationStructureGeometryKHR,_std::allocator<VkAccelerationStructureGeometryKHR>_>
                        ._M_impl.super__Vector_impl_data._M_start) / 0x60);
  vkBuildInfo.geometryCount = uVar12;
  if ((pRenderDeviceVk->
      super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
      ).super_RenderDeviceBase<Diligent::EngineVkImplTraits>.m_AdapterInfo.RayTracing.
      MaxGeometriesPerBLAS < uVar12) {
    FormatString<char[17],unsigned_int,char[25],unsigned_int,char[3]>
              ((string *)&MemReqs,(Diligent *)"Geometry count (",
               (char (*) [17])&vkBuildInfo.geometryCount,(uint *)") exceeds device limit (",
               (char (*) [25])
               &(pRenderDeviceVk->
                super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
                ).super_RenderDeviceBase<Diligent::EngineVkImplTraits>.m_AdapterInfo.RayTracing.
                MaxGeometriesPerBLAS,(uint *)0x668694,(char (*) [3])MemReqs.size);
    DebugAssertionFailed
              ((Char *)MemReqs.size,"BottomLevelASVkImpl",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/BottomLevelASVkImpl.cpp"
               ,0x8b);
    std::__cxx11::string::~string((string *)&MemReqs);
  }
  VulkanUtilities::VulkanLogicalDevice::GetAccelerationStructureBuildSizes
            (this_03,&vkBuildInfo,
             MaxPrimitiveCounts.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start,&vkSizeInfo);
  UVar19 = vkSizeInfo.accelerationStructureSize;
  auVar3._8_4_ = (undefined4)vkSizeInfo.buildScratchSize;
  auVar3._0_8_ = vkSizeInfo.updateScratchSize;
  auVar3._12_4_ = vkSizeInfo.buildScratchSize._4_4_;
  SVar20.Build = auVar3._8_8_;
  SVar20.Update._0_4_ = (int)vkSizeInfo.updateScratchSize;
  SVar20.Update._4_4_ = (int)(vkSizeInfo.updateScratchSize >> 0x20);
  (this->super_BottomLevelASBase<Diligent::EngineVkImplTraits>).m_ScratchSize = SVar20;
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&MaxPrimitiveCounts.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  std::
  _Vector_base<VkAccelerationStructureGeometryKHR,_std::allocator<VkAccelerationStructureGeometryKHR>_>
  ::~_Vector_base(&vkGeometries.
                   super__Vector_base<VkAccelerationStructureGeometryKHR,_std::allocator<VkAccelerationStructureGeometryKHR>_>
                 );
LAB_001acc1a:
  Args_1 = &(this->super_BottomLevelASBase<Diligent::EngineVkImplTraits>).
            super_DeviceObjectBase<Diligent::IBottomLevelASVk,_Diligent::RenderDeviceVkImpl,_Diligent::BottomLevelASDesc>
            .m_Desc;
  vkSizeInfo.accelerationStructureSize = 0;
  vkSizeInfo.buildScratchSize._4_4_ = 0;
  vkSizeInfo._4_12_ = SUB1612((undefined1  [16])0x0,4);
  vkSizeInfo.sType = VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO;
  vkSizeInfo.buildScratchSize._0_4_ = 0x120000;
  vkSizeInfo.updateScratchSize = UVar19;
  VulkanUtilities::VulkanLogicalDevice::CreateBuffer
            ((BufferWrapper *)&vkBuildInfo,this_03,(VkBufferCreateInfo *)&vkSizeInfo,
             (Args_1->super_DeviceObjectAttribs).Name);
  VulkanUtilities::VulkanObjectWrapper<VkBuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)2>::
  operator=(this_01,(VulkanObjectWrapper<VkBuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)2> *)
                    &vkBuildInfo);
  VulkanUtilities::VulkanObjectWrapper<VkBuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)2>::
  ~VulkanObjectWrapper
            ((VulkanObjectWrapper<VkBuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)2> *)
             &vkBuildInfo);
  VulkanUtilities::VulkanLogicalDevice::GetBufferMemoryRequirements
            (&MemReqs,this_03,(this->m_VulkanBuffer).m_VkObject);
  MemoryTypeIndex =
       VulkanUtilities::VulkanPhysicalDevice::GetMemoryTypeIndex(this_02,MemReqs.memoryTypeBits,1);
  if ((MemReqs.alignment ^ MemReqs.alignment - 1) <= MemReqs.alignment - 1) {
    FormatString<char[29]>((string *)&vkBuildInfo,(char (*) [29])"Alignment is not power of 2!");
    DebugAssertionFailed
              ((Char *)vkBuildInfo._0_8_,"BottomLevelASVkImpl",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/BottomLevelASVkImpl.cpp"
               ,0xa2);
    std::__cxx11::string::~string((string *)&vkBuildInfo);
  }
  RenderDeviceVkImpl::AllocateMemory
            ((VulkanMemoryAllocation *)&vkBuildInfo,pRenderDeviceVk,MemReqs.size,MemReqs.alignment,
             MemoryTypeIndex,2);
  pBVar7 = local_140;
  (local_140->m_MemoryAllocation).Page = (VulkanMemoryPage *)vkBuildInfo._0_8_;
  (local_140->m_MemoryAllocation).UnalignedOffset = (VkDeviceSize)vkBuildInfo.pNext;
  (local_140->m_MemoryAllocation).Size = vkBuildInfo._16_8_;
  vkBuildInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  vkBuildInfo._4_4_ = 0;
  vkBuildInfo.pNext = (void *)0x0;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = vkBuildInfo._24_8_;
  vkBuildInfo._16_16_ = auVar4 << 0x40;
  VulkanUtilities::VulkanMemoryAllocation::~VulkanMemoryAllocation
            ((VulkanMemoryAllocation *)&vkBuildInfo);
  if ((pBVar7->m_MemoryAllocation).Page == (VulkanMemoryPage *)0x0) {
    LogError<true,char[37],char_const*,char[3]>
              (false,"BottomLevelASVkImpl",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/BottomLevelASVkImpl.cpp"
               ,0xa5,(char (*) [37])"Failed to allocate memory for BLAS \'",(char **)Args_1,
               (char (*) [3])"\'.");
  }
  memoryOffset = AlignUp<unsigned_long,unsigned_long>
                           ((local_140->m_MemoryAllocation).UnalignedOffset,MemReqs.alignment);
  pBVar7 = local_140;
  local_140->m_MemoryAlignedOffset = memoryOffset;
  if ((local_140->m_MemoryAllocation).Size <
      (MemReqs.size + memoryOffset) - (local_140->m_MemoryAllocation).UnalignedOffset) {
    FormatString<char[39]>
              ((string *)&vkBuildInfo,(char (*) [39])"Size of memory allocation is too small");
    DebugAssertionFailed
              ((Char *)vkBuildInfo._0_8_,"BottomLevelASVkImpl",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/BottomLevelASVkImpl.cpp"
               ,0xa8);
    std::__cxx11::string::~string((string *)&vkBuildInfo);
    memoryOffset = pBVar7->m_MemoryAlignedOffset;
  }
  errorCode = VulkanUtilities::VulkanLogicalDevice::BindBufferMemory
                        (this_03,(pBVar7->m_VulkanBuffer).m_VkObject,
                         (((pBVar7->m_MemoryAllocation).Page)->m_VkMemory).m_VkObject,memoryOffset);
  if (errorCode != VK_SUCCESS) {
    pcVar15 = VulkanUtilities::VkResultToString(errorCode);
    vkBuildInfo._0_8_ = pcVar15;
    LogError<true,char[29],char[17],char_const*>
              (false,"BottomLevelASVkImpl",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/BottomLevelASVkImpl.cpp"
               ,0xab,(char (*) [29])"Failed to bind buffer memory",
               (char (*) [17])"\nVK Error Code: ",(char **)&vkBuildInfo);
  }
  vkBuildInfo._4_12_ = SUB1612((undefined1  [16])0x0,4);
  vkBuildInfo.sType = VK_STRUCTURE_TYPE_ACCELERATION_STRUCTURE_CREATE_INFO_KHR;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = (pBVar7->m_VulkanBuffer).m_VkObject;
  vkBuildInfo._16_16_ = auVar5 << 0x40;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = UVar19;
  vkBuildInfo._32_16_ = auVar6 << 0x40;
  vkBuildInfo._52_12_ = SUB1612((undefined1  [16])0x0,4);
  vkBuildInfo.geometryCount = 1;
  VulkanUtilities::VulkanLogicalDevice::CreateAccelStruct
            ((AccelStructWrapper *)&msg_1,this_03,
             (VkAccelerationStructureCreateInfoKHR *)&vkBuildInfo,
             (pBVar7->super_BottomLevelASBase<Diligent::EngineVkImplTraits>).
             super_DeviceObjectBase<Diligent::IBottomLevelASVk,_Diligent::RenderDeviceVkImpl,_Diligent::BottomLevelASDesc>
             .m_Desc.super_DeviceObjectAttribs.Name);
  VulkanUtilities::
  VulkanObjectWrapper<VkAccelerationStructureKHR_T_*,_(VulkanUtilities::VulkanHandleTypeId)21>::
  operator=(this_00,(VulkanObjectWrapper<VkAccelerationStructureKHR_T_*,_(VulkanUtilities::VulkanHandleTypeId)21>
                     *)&msg_1);
  VulkanUtilities::
  VulkanObjectWrapper<VkAccelerationStructureKHR_T_*,_(VulkanUtilities::VulkanHandleTypeId)21>::
  ~VulkanObjectWrapper
            ((VulkanObjectWrapper<VkAccelerationStructureKHR_T_*,_(VulkanUtilities::VulkanHandleTypeId)21>
              *)&msg_1);
  VVar16 = VulkanUtilities::VulkanLogicalDevice::GetAccelerationStructureDeviceAddress
                     (this_03,(pBVar7->m_VulkanBLAS).m_VkObject);
  pBVar7->m_DeviceAddress = VVar16;
  (pBVar7->super_BottomLevelASBase<Diligent::EngineVkImplTraits>).m_State =
       RESOURCE_STATE_BUILD_AS_READ;
  return;
}

Assistant:

BottomLevelASVkImpl::BottomLevelASVkImpl(IReferenceCounters*      pRefCounters,
                                         RenderDeviceVkImpl*      pRenderDeviceVk,
                                         const BottomLevelASDesc& Desc) :
    TBottomLevelASBase{pRefCounters, pRenderDeviceVk, Desc}
{
    const auto& LogicalDevice   = pRenderDeviceVk->GetLogicalDevice();
    const auto& PhysicalDevice  = pRenderDeviceVk->GetPhysicalDevice();
    const auto& RTProps         = pRenderDeviceVk->GetAdapterInfo().RayTracing;
    auto        AccelStructSize = m_Desc.CompactedSize;

    if (AccelStructSize == 0)
    {
        VkAccelerationStructureBuildGeometryInfoKHR     vkBuildInfo{};
        std::vector<VkAccelerationStructureGeometryKHR> vkGeometries;
        std::vector<uint32_t>                           MaxPrimitiveCounts;
        VkAccelerationStructureBuildSizesInfoKHR        vkSizeInfo{};
        vkSizeInfo.sType = VK_STRUCTURE_TYPE_ACCELERATION_STRUCTURE_BUILD_SIZES_INFO_KHR;

        vkGeometries.resize(size_t{Desc.TriangleCount} + size_t{Desc.BoxCount});
        MaxPrimitiveCounts.resize(vkGeometries.size());

        if (m_Desc.pTriangles != nullptr)
        {
            Uint32 MaxPrimitiveCount = 0;
            for (uint32_t i = 0; i < m_Desc.TriangleCount; ++i)
            {
                auto& src = m_Desc.pTriangles[i];
                auto& dst = vkGeometries[i];
                auto& tri = dst.geometry.triangles;

                dst.sType        = VK_STRUCTURE_TYPE_ACCELERATION_STRUCTURE_GEOMETRY_KHR;
                dst.pNext        = nullptr;
                dst.geometryType = VK_GEOMETRY_TYPE_TRIANGLES_KHR;
                dst.flags        = 0;

                tri.sType        = VK_STRUCTURE_TYPE_ACCELERATION_STRUCTURE_GEOMETRY_TRIANGLES_DATA_KHR;
                tri.pNext        = nullptr;
                tri.vertexFormat = TypeToVkFormat(src.VertexValueType, src.VertexComponentCount, src.VertexValueType < VT_FLOAT16);
                // maxVertex is the number of vertices in vertexData minus one.
                VERIFY(src.MaxVertexCount > 0, "MaxVertexCount must be greater than 0");
                tri.maxVertex = src.MaxVertexCount - 1;
                tri.indexType = TypeToVkIndexType(src.IndexType);
                // Non-null address indicates that non-null transform data will be provided to the build command.
                tri.transformData.deviceAddress = src.AllowsTransforms ? 1 : 0;
                MaxPrimitiveCounts[i]           = src.MaxPrimitiveCount;

                MaxPrimitiveCount += src.MaxPrimitiveCount;

#ifdef DILIGENT_DEVELOPMENT
#    if DILIGENT_USE_VOLK
                {
                    VkFormatProperties2 vkProps{};
                    vkProps.sType = VK_STRUCTURE_TYPE_FORMAT_PROPERTIES_2;
                    vkGetPhysicalDeviceFormatProperties2KHR(PhysicalDevice.GetVkDeviceHandle(), tri.vertexFormat, &vkProps);

                    DEV_CHECK_ERR((vkProps.formatProperties.bufferFeatures & VK_FORMAT_FEATURE_ACCELERATION_STRUCTURE_VERTEX_BUFFER_BIT_KHR) != 0,
                                  "combination of pTriangles[", i, "].VertexValueType (", GetValueTypeString(src.VertexValueType),
                                  ") and pTriangles[", i, "].VertexComponentCount (", src.VertexComponentCount, ") is not supported by this device.");
                }
#    else
                UNSUPPORTED("vkGetPhysicalDeviceFormatProperties2KHR is only available through Volk");
#    endif
#endif
            }
            DEV_CHECK_ERR(MaxPrimitiveCount <= RTProps.MaxPrimitivesPerBLAS,
                          "Max primitives count (", MaxPrimitiveCount, ") exceeds device limit (", RTProps.MaxPrimitivesPerBLAS, ")");
            (void)MaxPrimitiveCount;
        }
        else if (m_Desc.pBoxes != nullptr)
        {
            Uint32 MaxBoxCount = 0;
            for (uint32_t i = 0; i < m_Desc.BoxCount; ++i)
            {
                auto& src = m_Desc.pBoxes[i];
                auto& dst = vkGeometries[i];
                auto& box = dst.geometry.aabbs;

                dst.sType        = VK_STRUCTURE_TYPE_ACCELERATION_STRUCTURE_GEOMETRY_KHR;
                dst.pNext        = nullptr;
                dst.geometryType = VK_GEOMETRY_TYPE_AABBS_KHR;

                box.sType             = VK_STRUCTURE_TYPE_ACCELERATION_STRUCTURE_GEOMETRY_AABBS_DATA_KHR;
                box.pNext             = nullptr;
                MaxPrimitiveCounts[i] = src.MaxBoxCount;

                MaxBoxCount += src.MaxBoxCount;
            }
            DEV_CHECK_ERR(MaxBoxCount <= RTProps.MaxPrimitivesPerBLAS,
                          "Max box count (", MaxBoxCount, ") exceeds device limit (", RTProps.MaxPrimitivesPerBLAS, ")");
            (void)MaxBoxCount;
        }
        else
        {
            UNEXPECTED("Either pTriangles or pBoxes must not be null");
        }

        vkBuildInfo.sType         = VK_STRUCTURE_TYPE_ACCELERATION_STRUCTURE_BUILD_GEOMETRY_INFO_KHR;
        vkBuildInfo.flags         = BuildASFlagsToVkBuildAccelerationStructureFlags(m_Desc.Flags);
        vkBuildInfo.type          = VK_ACCELERATION_STRUCTURE_TYPE_BOTTOM_LEVEL_KHR;
        vkBuildInfo.pGeometries   = vkGeometries.data();
        vkBuildInfo.geometryCount = static_cast<uint32_t>(vkGeometries.size());

        DEV_CHECK_ERR(vkBuildInfo.geometryCount <= RTProps.MaxGeometriesPerBLAS, "Geometry count (", vkBuildInfo.geometryCount,
                      ") exceeds device limit (", RTProps.MaxGeometriesPerBLAS, ").");

        LogicalDevice.GetAccelerationStructureBuildSizes(vkBuildInfo, MaxPrimitiveCounts.data(), vkSizeInfo);

        AccelStructSize      = vkSizeInfo.accelerationStructureSize;
        m_ScratchSize.Build  = vkSizeInfo.buildScratchSize;
        m_ScratchSize.Update = vkSizeInfo.updateScratchSize;
    }

    VkBufferCreateInfo vkBuffCI{};
    vkBuffCI.sType                 = VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO;
    vkBuffCI.flags                 = 0;
    vkBuffCI.size                  = AccelStructSize;
    vkBuffCI.usage                 = VK_BUFFER_USAGE_ACCELERATION_STRUCTURE_STORAGE_BIT_KHR | VK_BUFFER_USAGE_SHADER_DEVICE_ADDRESS_BIT;
    vkBuffCI.sharingMode           = VK_SHARING_MODE_EXCLUSIVE;
    vkBuffCI.queueFamilyIndexCount = 0;
    vkBuffCI.pQueueFamilyIndices   = nullptr;

    m_VulkanBuffer = LogicalDevice.CreateBuffer(vkBuffCI, m_Desc.Name);

    VkMemoryRequirements MemReqs         = LogicalDevice.GetBufferMemoryRequirements(m_VulkanBuffer);
    uint32_t             MemoryTypeIndex = PhysicalDevice.GetMemoryTypeIndex(MemReqs.memoryTypeBits, VK_MEMORY_PROPERTY_DEVICE_LOCAL_BIT);

    VERIFY(IsPowerOfTwo(MemReqs.alignment), "Alignment is not power of 2!");
    m_MemoryAllocation = pRenderDeviceVk->AllocateMemory(MemReqs.size, MemReqs.alignment, MemoryTypeIndex, VK_MEMORY_ALLOCATE_DEVICE_ADDRESS_BIT);
    if (!m_MemoryAllocation)
        LOG_ERROR_AND_THROW("Failed to allocate memory for BLAS '", m_Desc.Name, "'.");

    m_MemoryAlignedOffset = AlignUp(VkDeviceSize{m_MemoryAllocation.UnalignedOffset}, MemReqs.alignment);
    VERIFY(m_MemoryAllocation.Size >= MemReqs.size + (m_MemoryAlignedOffset - m_MemoryAllocation.UnalignedOffset), "Size of memory allocation is too small");
    auto Memory = m_MemoryAllocation.Page->GetVkMemory();
    auto err    = LogicalDevice.BindBufferMemory(m_VulkanBuffer, Memory, m_MemoryAlignedOffset);
    CHECK_VK_ERROR_AND_THROW(err, "Failed to bind buffer memory");

    VkAccelerationStructureCreateInfoKHR vkAccelStrCI{};
    vkAccelStrCI.sType       = VK_STRUCTURE_TYPE_ACCELERATION_STRUCTURE_CREATE_INFO_KHR;
    vkAccelStrCI.createFlags = 0;
    vkAccelStrCI.buffer      = m_VulkanBuffer;
    vkAccelStrCI.offset      = 0;
    vkAccelStrCI.size        = AccelStructSize;
    vkAccelStrCI.type        = VK_ACCELERATION_STRUCTURE_TYPE_BOTTOM_LEVEL_KHR;

    m_VulkanBLAS = LogicalDevice.CreateAccelStruct(vkAccelStrCI, m_Desc.Name);

    m_DeviceAddress = LogicalDevice.GetAccelerationStructureDeviceAddress(m_VulkanBLAS);

    SetState(RESOURCE_STATE_BUILD_AS_READ);
}